

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O1

bool SetGenericProperty<int>
               (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                *list,char *szName,int *value)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  pair<unsigned_int,_int> local_28;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/GenericProperty.h"
                  ,0x39,
                  "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = int]"
                 );
  }
  sVar4 = strlen(szName);
  uVar3 = (uint)sVar4;
  uVar6 = 0;
  if (3 < uVar3) {
    uVar2 = uVar3 >> 2;
    uVar6 = 0;
    do {
      uVar6 = (*(ushort *)szName + uVar6) * 0x10000 ^
              ((uint)(byte)*(ushort *)((long)szName + 2) << 0xb |
              (uint)*(byte *)((long)szName + 3) << 0x13) ^ *(ushort *)szName + uVar6;
      szName = (char *)((long)szName + 4);
      uVar6 = (uVar6 >> 0xb) + uVar6;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  switch(uVar3 & 3) {
  case 0:
    goto switchD_00138eec_caseD_0;
  case 1:
    uVar6 = uVar6 + (int)(char)*(ushort *)szName;
    uVar3 = uVar6 * 0x400 ^ uVar6;
    uVar6 = uVar3 >> 1;
    break;
  case 2:
    uVar6 = (*(ushort *)szName + uVar6) * 0x800 ^ *(ushort *)szName + uVar6;
    uVar6 = (uVar6 >> 0x11) + uVar6;
    goto switchD_00138eec_caseD_0;
  case 3:
    uVar3 = (*(ushort *)szName + uVar6) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ *(ushort *)szName + uVar6;
    uVar6 = uVar3 >> 0xb;
  }
  uVar6 = uVar6 + uVar3;
switchD_00138eec_caseD_0:
  uVar6 = uVar6 * 8 ^ uVar6;
  uVar6 = (uVar6 >> 5) + uVar6;
  uVar6 = uVar6 * 0x10 ^ uVar6;
  uVar6 = (uVar6 >> 0x11) + uVar6;
  uVar6 = uVar6 * 0x2000000 ^ uVar6;
  local_28.first = (uVar6 >> 6) + uVar6;
  p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  p_Var7 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar8]) {
    bVar8 = p_Var7[1]._M_color < local_28.first;
    if (!bVar8) {
      p_Var5 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var7 = p_Var5, local_28.first < p_Var5[1]._M_color)) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_28.second = *value;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
    ::_M_emplace_unique<std::pair<unsigned_int,int>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,int>,std::_Select1st<std::pair<unsigned_int_const,int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,int>>>
                *)list,&local_28);
  }
  else {
    *(int *)&p_Var7[1].field_0x4 = *value;
  }
  return (_Rb_tree_header *)p_Var7 != p_Var1;
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}